

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.cpp
# Opt level: O1

void __thiscall slang::ast::EvalContext::reportStack(EvalContext *this,Diagnostic *diag)

{
  uint uVar1;
  ulong uVar2;
  Diagnostic *this_00;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  pointer pFVar6;
  FormatBuffer buffer;
  undefined1 *local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  code *local_240;
  undefined1 local_238 [504];
  undefined1 local_40;
  
  uVar2 = (this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.len;
  uVar1 = (((this->astCtx).scope.ptr)->compilation->options).maxConstexprBacktrace;
  uVar3 = (ulong)uVar1;
  if (uVar3 == 0 || uVar2 <= uVar3) {
    uStack_250 = 0;
    local_240 = ::fmt::v11::basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::
                grow;
    local_248 = 500;
    local_40 = 0;
    pFVar6 = (this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_;
    local_258 = local_238;
    for (lVar4 = uVar2 * 0x50; lVar4 != 0; lVar4 = lVar4 + -0x50) {
      reportFrame(diag,(Frame *)(&pFVar6[-1].temporaries._M_t._M_impl.field_0x0 + lVar4));
    }
    if (local_258 != local_238) {
      free(local_258);
    }
  }
  else {
    uVar5 = (ulong)(uVar1 >> 1);
    if (1 < uVar1) {
      lVar4 = uVar5 * -0x50;
      pFVar6 = (this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_ + uVar2;
      do {
        pFVar6 = pFVar6 + -1;
        reportFrame(diag,pFVar6);
        lVar4 = lVar4 + 0x50;
      } while (lVar4 != 0);
    }
    this_00 = Diagnostic::addNote(diag,(DiagCode)0x21000c,
                                  (this->stack).
                                  super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_
                                  [(this->stack).
                                   super_SmallVectorBase<slang::ast::EvalContext::Frame>.len +
                                   (-1 - uVar5)].callLocation);
    local_258 = (undefined1 *)
                ((this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.len - uVar3);
    std::
    vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ::emplace_back<unsigned_long>(&this_00->args,(unsigned_long *)&local_258);
    pFVar6 = (this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_;
    if ((pointer)(&pFVar6[uVar5].temporaries._M_t._M_impl.field_0x0 + (uVar1 & 1) * 0x50) != pFVar6)
    {
      lVar4 = uVar5 * 0x50 + (ulong)((uVar1 & 1) * 0x50);
      do {
        reportFrame(diag,(Frame *)(&pFVar6[-1].temporaries._M_t._M_impl.field_0x0 + lVar4));
        lVar4 = lVar4 + -0x50;
      } while (lVar4 != 0);
    }
  }
  return;
}

Assistant:

void EvalContext::reportStack(Diagnostic& diag) const {
    const size_t limit = getCompilation().getOptions().maxConstexprBacktrace;
    if (stack.size() <= limit || limit == 0) {
        FormatBuffer buffer;
        for (const Frame& frame : std::views::reverse(stack))
            reportFrame(diag, frame);
        return;
    }

    const ptrdiff_t start = ptrdiff_t(limit / 2);
    const ptrdiff_t end = start + ptrdiff_t(limit % 2);
    auto reversed = std::views::reverse(stack);
    for (auto it = reversed.begin(), itEnd = it + start; it != itEnd; it++)
        reportFrame(diag, *it);

    diag.addNote(diag::NoteSkippingFrames, (reversed.begin() + start)->callLocation)
        << stack.size() - limit;

    for (auto it = reversed.end() - end, itEnd = reversed.end(); it != itEnd; it++)
        reportFrame(diag, *it);
}